

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O2

void __thiscall
duckdb::Linenoise::AddErrorHighlighting
          (Linenoise *this,idx_t render_start,idx_t render_end,
          vector<duckdb::highlightToken,_true> *tokens)

{
  undefined1 *puVar1;
  byte bVar2;
  char cVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  pointer puVar7;
  idx_t idx;
  pointer phVar8;
  vector<unsigned_long,_true> *pvVar9;
  reference pvVar10;
  size_t *psVar11;
  reference pvVar12;
  long lVar13;
  idx_t c;
  ulong uVar14;
  pointer phVar15;
  ulong __n;
  ulong uVar16;
  iterator __end1;
  uint uVar17;
  uint uVar18;
  unsigned_long *error;
  pointer puVar19;
  allocator local_179;
  vector<duckdb::highlightToken,_true> new_tokens;
  idx_t quote_pos;
  idx_t local_150;
  value_type local_148;
  vector<unsigned_long,_true> errors;
  vector<unsigned_long,_true> comment_start;
  vector<unsigned_long,_true> cursor_brackets;
  vector<unsigned_long,_true> comment_end;
  vector<unsigned_long,_true> curly_brackets;
  vector<unsigned_long,_true> square_brackets;
  vector<unsigned_long,_true> brackets;
  string dollar_quote_marker;
  
  if ((enableErrorRendering == '\0') && (phVar15 = (pointer)this->len, phVar15 < (pointer)0x7d0)) {
    brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    square_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    square_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    square_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    curly_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    curly_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    curly_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    errors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    comment_start.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    comment_start.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    comment_start.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    comment_end.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    comment_end.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    comment_end.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dollar_quote_marker._M_dataplus._M_p = (pointer)&dollar_quote_marker.field_2;
    dollar_quote_marker._M_string_length = 0;
    dollar_quote_marker.field_2._M_local_buf[0] = '\0';
    quote_pos = 0;
    uVar17 = 0;
    local_150 = render_end;
    for (new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl
         .super__Vector_impl_data._M_start = (pointer)0x0;
        new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
        super__Vector_impl_data._M_start < phVar15;
        new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&(new_tokens.
                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        .
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_0x1) {
      pcVar4 = this->buf;
      bVar2 = pcVar4[(long)new_tokens.
                           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           .
                           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                           ._M_impl.super__Vector_impl_data._M_start];
      uVar17 = 0;
      uVar18 = 0;
      if (bVar2 - 0x22 < 0xc) {
        pvVar9 = &brackets;
        switch((uint)bVar2) {
        case 0x22:
          uVar17 = 2;
          quote_pos = (idx_t)new_tokens.
                             super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             .
                             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          break;
        case 0x24:
          puVar1 = &(new_tokens.
                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
          phVar8 = (pointer)puVar1;
          uVar17 = uVar18;
          if (puVar1 < phVar15) {
            for (; phVar8 < phVar15; phVar8 = (pointer)&phVar8->field_0x1) {
              cVar3 = pcVar4[(long)phVar8];
              if (cVar3 == '$') {
                if (phVar8 != (pointer)0x0) {
                  local_148._0_8_ = (long)&local_148 + 0x10;
                  quote_pos = (idx_t)new_tokens.
                                     super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     .
                                     super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                  new_tokens.
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                  ._M_impl.super__Vector_impl_data._M_start = phVar8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_148,pcVar4 + (long)puVar1,pcVar4 + (long)phVar8);
                  ::std::__cxx11::string::operator=
                            ((string *)&dollar_quote_marker,(string *)&local_148);
                  ::std::__cxx11::string::~string((string *)&local_148);
                  uVar17 = 4;
                }
                break;
              }
              if (((0x19 < (byte)(cVar3 + 0xbfU)) && (-1 < cVar3 && 0x19 < (byte)(cVar3 + 0x9fU)))
                 && ((phVar8 <= puVar1 || (9 < (byte)(cVar3 - 0x30U))))) break;
            }
          }
          break;
        case 0x27:
          uVar17 = 1;
          quote_pos = (idx_t)new_tokens.
                             super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             .
                             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          break;
        case 0x28:
          pvVar9 = &brackets;
LAB_001f1c6a:
          OpenBracket(pvVar9,&cursor_brackets,this->pos,
                      (idx_t)new_tokens.
                             super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             .
                             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          uVar17 = uVar18;
          break;
        case 0x29:
          goto LAB_001f1c86;
        case 0x2d:
          uVar17 = uVar18;
          if ((&(new_tokens.
                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_start)->field_0x1 < phVar15) &&
             (pcVar4[(long)&(new_tokens.
                             super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             .
                             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0x1] == '-')) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&comment_start,
                       (value_type_conflict2 *)&new_tokens);
            new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
            .super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)&(new_tokens.
                            super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            .
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
            uVar17 = 3;
          }
        }
      }
      else {
        if (bVar2 == 0x5b) {
          pvVar9 = &square_brackets;
          goto LAB_001f1c6a;
        }
        if (bVar2 == 0x5d) {
          pvVar9 = &square_brackets;
        }
        else {
          if (bVar2 == 0x7b) {
            pvVar9 = &curly_brackets;
            goto LAB_001f1c6a;
          }
          if (bVar2 != 0x7d) goto LAB_001f1cea;
          pvVar9 = &curly_brackets;
        }
LAB_001f1c86:
        CloseBracket(pvVar9,&cursor_brackets,this->pos,
                     (idx_t)new_tokens.
                            super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            .
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_start,&errors);
      }
LAB_001f1cea:
      phVar15 = (pointer)this->len;
    }
    if ((uVar17 < 5) && ((0x16U >> uVar17 & 1) != 0)) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&errors,&quote_pos);
    }
    HandleBracketErrors(&brackets,&errors);
    HandleBracketErrors(&square_brackets,&errors);
    HandleBracketErrors(&curly_brackets,&errors);
    puVar7 = errors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar19 = errors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar19 != puVar7; puVar19 = puVar19 + 1) {
      ::std::__cxx11::string::string
                ((string *)&local_148,"Error found at position %llu\n",(allocator *)&new_tokens);
      ::std::__cxx11::string::~string((string *)&local_148);
      uVar14 = *puVar19;
      if (uVar14 <= local_150 && render_start <= uVar14) {
        InsertToken(TOKEN_ERROR,uVar14 - render_start,tokens);
      }
    }
    if ((long)cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10 &&
        cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    puVar7 = cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar19 = cursor_brackets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar19 != puVar7; puVar19 = puVar19 + 1) {
      ::std::__cxx11::string::string
                ((string *)&local_148,"Highlight bracket at position %d\n",(allocator *)&new_tokens)
      ;
      ::std::__cxx11::string::~string((string *)&local_148);
      uVar14 = *puVar19;
      if (uVar14 <= local_150 && render_start <= uVar14) {
        InsertToken(TOKEN_BRACKET,uVar14 - render_start,tokens);
      }
    }
    if (comment_start.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        comment_start.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_tokens.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
                (&new_tokens.
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                 ((long)(tokens->
                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ).
                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(tokens->
                       super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ).
                       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = 0;
      for (uVar14 = 0;
          uVar14 < (ulong)((long)comment_start.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)comment_start.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar14 = uVar14 + 1
          ) {
        pvVar10 = vector<unsigned_long,_true>::get<true>(&comment_start,uVar14);
        uVar5 = *pvVar10;
        psVar11 = &this->len;
        if (uVar14 < (ulong)((long)comment_end.
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)comment_end.
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          psVar11 = vector<unsigned_long,_true>::get<true>(&comment_end,uVar14);
        }
        uVar6 = *psVar11;
        uVar16 = uVar5 - render_start;
        if (uVar6 <= local_150 && render_start <= uVar5) {
          ::std::__cxx11::string::string
                    ((string *)&local_148,"Comment at position %d to %d\n",&local_179);
          ::std::__cxx11::string::~string((string *)&local_148);
          local_148.type = 5;
          local_148.search_match = false;
          local_148.start = uVar16;
LAB_001f1f30:
          if (__n < (ulong)(((long)(tokens->
                                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                   ).
                                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(tokens->
                                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ).
                                  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
            pvVar12 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n);
            if (pvVar12->start < uVar16) goto code_r0x001f1f55;
            ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
            push_back(&new_tokens.
                       super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ,&local_148);
            while ((__n < (ulong)(((long)(tokens->
                                         super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                         ).
                                         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(tokens->
                                        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                        ).
                                        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) &&
                   (pvVar12 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n),
                   pvVar12->start <= uVar6 - render_start))) {
              __n = __n + 1;
            }
          }
          else {
            ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
            push_back(&new_tokens.
                       super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ,&local_148);
          }
        }
      }
      for (; lVar13 = (long)(tokens->
                            super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ).
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(tokens->
                            super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ).
                            super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                            ._M_impl.super__Vector_impl_data._M_start, __n < (ulong)(lVar13 / 0x18);
          __n = __n + 1) {
        pvVar12 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n);
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  (&new_tokens.
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                   pvVar12);
      }
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::_M_move_assign
                (&tokens->
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                 (_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                 &new_tokens,lVar13 % 0x18);
      ::std::_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
      ~_Vector_base((_Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *
                    )&new_tokens);
    }
    ::std::__cxx11::string::~string((string *)&dollar_quote_marker);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&comment_end);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&comment_start);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&cursor_brackets);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&errors);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&curly_brackets);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&square_brackets);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&brackets);
  }
  return;
code_r0x001f1f55:
  pvVar12 = vector<duckdb::highlightToken,_true>::get<true>(tokens,__n);
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
            (&new_tokens.
              super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,pvVar12)
  ;
  __n = __n + 1;
  goto LAB_001f1f30;
}

Assistant:

void Linenoise::AddErrorHighlighting(idx_t render_start, idx_t render_end, vector<highlightToken> &tokens) const {
	static constexpr const idx_t MAX_ERROR_LENGTH = 2000;
	if (!enableErrorRendering) {
		return;
	}
	if (len >= MAX_ERROR_LENGTH) {
		return;
	}
	// do a pass over the buffer to collect errors:
	// * brackets without matching closing/opening bracket
	// * single quotes without matching closing single quote
	// * double quote without matching double quote
	ScanState state = ScanState::STANDARD;
	vector<idx_t> brackets;        // ()
	vector<idx_t> square_brackets; // []
	vector<idx_t> curly_brackets;  // {}
	vector<idx_t> errors;
	vector<idx_t> cursor_brackets;
	vector<idx_t> comment_start;
	vector<idx_t> comment_end;
	string dollar_quote_marker;
	idx_t quote_pos = 0;
	for (idx_t i = 0; i < len; i++) {
		auto c = buf[i];
		switch (state) {
		case ScanState::STANDARD:
			switch (c) {
			case '-':
				if (i + 1 < len && buf[i + 1] == '-') {
					// -- puts us in a comment
					comment_start.push_back(i);
					i++;
					state = ScanState::IN_COMMENT;
					break;
				}
				break;
			case '\'':
				state = ScanState::IN_SINGLE_QUOTE;
				quote_pos = i;
				break;
			case '\"':
				state = ScanState::IN_DOUBLE_QUOTE;
				quote_pos = i;
				break;
			case '(':
				OpenBracket(brackets, cursor_brackets, pos, i);
				break;
			case '[':
				OpenBracket(square_brackets, cursor_brackets, pos, i);
				break;
			case '{':
				OpenBracket(curly_brackets, cursor_brackets, pos, i);
				break;
			case ')':
				CloseBracket(brackets, cursor_brackets, pos, i, errors);
				break;
			case ']':
				CloseBracket(square_brackets, cursor_brackets, pos, i, errors);
				break;
			case '}':
				CloseBracket(curly_brackets, cursor_brackets, pos, i, errors);
				break;
			case '$': { // dollar symbol
				if (i + 1 >= len) {
					// we need more than just a dollar
					break;
				}
				// check if this is a dollar-quoted string
				idx_t next_dollar = 0;
				for (idx_t idx = i + 1; idx < len; idx++) {
					if (buf[idx] == '$') {
						// found the next dollar
						next_dollar = idx;
						break;
					}
					// all characters can be between A-Z, a-z or \200 - \377
					if (buf[idx] >= 'A' && buf[idx] <= 'Z') {
						continue;
					}
					if (buf[idx] >= 'a' && buf[idx] <= 'z') {
						continue;
					}
					if (buf[idx] >= '\200' && buf[idx] <= '\377') {
						continue;
					}
					// the first character CANNOT be a numeric, only subsequent characters
					if (idx > i + 1 && buf[idx] >= '0' && buf[idx] <= '9') {
						continue;
					}
					// not a dollar quoted string
					break;
				}
				if (next_dollar == 0) {
					// not a dollar quoted string
					break;
				}
				// dollar quoted string
				state = ScanState::DOLLAR_QUOTED_STRING;
				quote_pos = i;
				i = next_dollar;
				if (i < len) {
					// found a complete marker - store it
					idx_t marker_start = quote_pos + 1;
					dollar_quote_marker = string(buf + marker_start, i - marker_start);
				}
				break;
			}
			default:
				break;
			}
			break;
		case ScanState::IN_COMMENT:
			// comment state - the only thing that will get us out is a newline
			switch (c) {
			case '\r':
			case '\n':
				// newline - left comment state
				state = ScanState::STANDARD;
				comment_end.push_back(i);
				break;
			default:
				break;
			}
			break;
		case ScanState::IN_SINGLE_QUOTE:
			// single quote - all that will get us out is an unescaped single-quote
			if (c == '\'') {
				if (i + 1 < len && buf[i + 1] == '\'') {
					// double single-quote means the quote is escaped - continue
					i++;
					break;
				} else {
					// otherwise revert to standard scan state
					state = ScanState::STANDARD;
					break;
				}
			}
			break;
		case ScanState::IN_DOUBLE_QUOTE:
			// double quote - all that will get us out is an unescaped quote
			if (c == '"') {
				if (i + 1 < len && buf[i + 1] == '"') {
					// double quote means the quote is escaped - continue
					i++;
					break;
				} else {
					// otherwise revert to standard scan state
					state = ScanState::STANDARD;
					break;
				}
			}
			break;
		case ScanState::DOLLAR_QUOTED_STRING: {
			// dollar-quoted string - all that will get us out is a $[marker]$
			if (c != '$') {
				break;
			}
			if (i + 1 >= len) {
				// no room for the final dollar
				break;
			}
			// skip to the next dollar symbol
			idx_t start = i + 1;
			idx_t end = start;
			while (end < len && buf[end] != '$') {
				end++;
			}
			if (end >= len) {
				// no final dollar found - continue as normal
				break;
			}
			if (end - start != dollar_quote_marker.size()) {
				// length mismatch - cannot match
				break;
			}
			if (memcmp(buf + start, dollar_quote_marker.c_str(), dollar_quote_marker.size()) != 0) {
				// marker mismatch
				break;
			}
			// marker found! revert to standard state
			dollar_quote_marker = string();
			state = ScanState::STANDARD;
			i = end;
			break;
		}
		default:
			break;
		}
	}
	if (state == ScanState::IN_DOUBLE_QUOTE || state == ScanState::IN_SINGLE_QUOTE ||
	    state == ScanState::DOLLAR_QUOTED_STRING) {
		// quote is never closed
		errors.push_back(quote_pos);
	}
	HandleBracketErrors(brackets, errors);
	HandleBracketErrors(square_brackets, errors);
	HandleBracketErrors(curly_brackets, errors);

	// insert all the errors for highlighting
	for (auto &error : errors) {
		Linenoise::Log("Error found at position %llu\n", error);
		if (error < render_start || error > render_end) {
			continue;
		}
		auto render_error = error - render_start;
		InsertToken(tokenType::TOKEN_ERROR, render_error, tokens);
	}
	if (cursor_brackets.size() != 2) {
		// no matching cursor brackets found
		cursor_brackets.clear();
	}
	// insert bracket for highlighting
	for (auto &bracket_position : cursor_brackets) {
		Linenoise::Log("Highlight bracket at position %d\n", bracket_position);
		if (bracket_position < render_start || bracket_position > render_end) {
			continue;
		}

		idx_t render_position = bracket_position - render_start;
		InsertToken(tokenType::TOKEN_BRACKET, render_position, tokens);
	}
	// insert comments
	if (!comment_start.empty()) {
		vector<highlightToken> new_tokens;
		new_tokens.reserve(tokens.size());
		idx_t token_idx = 0;
		for (idx_t c = 0; c < comment_start.size(); c++) {
			auto c_start = comment_start[c];
			auto c_end = c < comment_end.size() ? comment_end[c] : len;
			if (c_start < render_start || c_end > render_end) {
				continue;
			}
			Linenoise::Log("Comment at position %d to %d\n", c_start, c_end);
			c_start -= render_start;
			c_end -= render_start;
			bool inserted_comment = false;

			highlightToken comment_token;
			comment_token.start = c_start;
			comment_token.type = tokenType::TOKEN_COMMENT;
			comment_token.search_match = false;

			for (; token_idx < tokens.size(); token_idx++) {
				if (tokens[token_idx].start >= c_start) {
					// insert the comment here
					new_tokens.push_back(comment_token);
					inserted_comment = true;
					break;
				}
				new_tokens.push_back(tokens[token_idx]);
			}
			if (!inserted_comment) {
				new_tokens.push_back(comment_token);
			} else {
				// skip all tokens until we exit the comment again
				for (; token_idx < tokens.size(); token_idx++) {
					if (tokens[token_idx].start > c_end) {
						break;
					}
				}
			}
		}
		for (; token_idx < tokens.size(); token_idx++) {
			new_tokens.push_back(tokens[token_idx]);
		}
		tokens = std::move(new_tokens);
	}
}